

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdiSubWindowPrivate::setFocusWidget(QMdiSubWindowPrivate *this)

{
  bool bVar1;
  FocusPolicy FVar2;
  QWidget *pQVar3;
  QWidget *this_00;
  QMdiSubWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidget *focusWidget;
  QWidget *focusWidget_1;
  QMdiSubWindow *q;
  WindowState in_stack_ffffffffffffffbc;
  uint6 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc6;
  undefined1 in_stack_ffffffffffffffc7;
  undefined1 uVar4;
  QWidget *local_30;
  QFlagsStorageHelper<Qt::WindowState,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = &q_func(in_RDI)->super_QWidget;
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x62d7e0);
  if (bVar1) {
    if (in_RDI->focusInReason == TabFocusReason) {
      QWidget::focusNextChild((QWidget *)0x62d80b);
    }
    else if (in_RDI->focusInReason == BacktabFocusReason) {
      QWidget::focusPreviousChild((QWidget *)0x62d828);
    }
    else {
      QWidget::windowState
                ((QWidget *)
                 CONCAT17(in_stack_ffffffffffffffc7,
                          CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)));
      local_c.super_QFlagsStorage<Qt::WindowState>.i =
           (QFlagsStorage<Qt::WindowState>)
           QFlags<Qt::WindowState>::operator&
                     ((QFlags<Qt::WindowState> *)
                      CONCAT17(in_stack_ffffffffffffffc7,
                               CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)),
                      in_stack_ffffffffffffffbc);
      bVar1 = QFlags<Qt::WindowState>::operator!((QFlags<Qt::WindowState> *)&local_c);
      uVar4 = false;
      if (bVar1) {
        uVar4 = restoreFocus(in_RDI);
      }
      if ((bool)uVar4 == false) {
        QPointer<QWidget>::operator->((QPointer<QWidget> *)0x62d895);
        this_00 = QWidget::focusWidget((QWidget *)0x62d89d);
        if (this_00 == (QWidget *)0x0) {
          local_30 = QWidget::nextInFocusChain
                               ((QWidget *)
                                CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffffc6,
                                                        in_stack_ffffffffffffffc0)));
          while( true ) {
            bVar1 = false;
            if ((local_30 != (QWidget *)0x0) && (bVar1 = false, local_30 != pQVar3)) {
              FVar2 = QWidget::focusPolicy(local_30);
              bVar1 = FVar2 == NoFocus;
            }
            if (bVar1 == false) break;
            local_30 = QWidget::nextInFocusChain
                                 ((QWidget *)
                                  CONCAT17(uVar4,CONCAT16(bVar1,in_stack_ffffffffffffffc0)));
          }
          if ((local_30 == (QWidget *)0x0) ||
             (bVar1 = QWidget::isAncestorOf
                                ((QWidget *)in_RDI,
                                 (QWidget *)CONCAT17(uVar4,(uint7)in_stack_ffffffffffffffc0)),
             !bVar1)) {
            pQVar3 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x62d9ad);
            FVar2 = QWidget::focusPolicy(pQVar3);
            if (FVar2 == NoFocus) {
              bVar1 = QWidget::hasFocus(this_00);
              if (!bVar1) {
                QWidget::setFocus((QWidget *)0x62d9ed);
              }
            }
            else {
              QPointer<QWidget>::operator->((QPointer<QWidget> *)0x62d9cb);
              QWidget::setFocus((QWidget *)0x62d9d3);
            }
          }
          else {
            QWidget::setFocus((QWidget *)0x62d99a);
          }
        }
        else {
          bVar1 = QWidget::hasFocus(this_00);
          if ((((bVar1) ||
               (bVar1 = QWidget::isAncestorOf
                                  ((QWidget *)in_RDI,
                                   (QWidget *)
                                   CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffffc6,
                                                           in_stack_ffffffffffffffc0))), !bVar1)) ||
              (bVar1 = QWidget::isVisible((QWidget *)0x62d8d7), !bVar1)) ||
             ((bVar1 = QWidget::isMinimized(pQVar3), bVar1 ||
              (FVar2 = QWidget::focusPolicy(this_00), FVar2 == NoFocus)))) {
            QWidget::setFocus((QWidget *)0x62d910);
          }
          else {
            QWidget::setFocus((QWidget *)0x62d904);
          }
        }
      }
    }
  }
  else {
    QWidget::setFocus((QWidget *)0x62d7ee);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindowPrivate::setFocusWidget()
{
    Q_Q(QMdiSubWindow);
    if (!baseWidget) {
        q->setFocus();
        return;
    }

    // This will give focus to the next child if possible, otherwise
    // do nothing, hence it's not possible to tab between windows with
    // just hitting tab (unless Qt::TabFocus is removed from the focus policy).
    if (focusInReason == Qt::TabFocusReason) {
        q->focusNextChild();
        return;
    }

    // Same as above, but gives focus to the previous child.
    if (focusInReason == Qt::BacktabFocusReason) {
        q->focusPreviousChild();
        return;
    }

    if (!(q->windowState() & Qt::WindowMinimized) && restoreFocus())
        return;

    if (QWidget *focusWidget = baseWidget->focusWidget()) {
        if (!focusWidget->hasFocus() && q->isAncestorOf(focusWidget)
                && focusWidget->isVisible() && !q->isMinimized()
                && focusWidget->focusPolicy() != Qt::NoFocus) {
            focusWidget->setFocus();
        } else {
            q->setFocus();
        }
        return;
    }

    QWidget *focusWidget = q->nextInFocusChain();
    while (focusWidget && focusWidget != q && focusWidget->focusPolicy() == Qt::NoFocus)
        focusWidget = focusWidget->nextInFocusChain();
    if (focusWidget && q->isAncestorOf(focusWidget))
        focusWidget->setFocus();
    else if (baseWidget->focusPolicy() != Qt::NoFocus)
        baseWidget->setFocus();
    else if (!q->hasFocus())
        q->setFocus();
}